

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

void big_array_iter_advance(BigArrayIter *iter)

{
  BigArray *pBVar1;
  ulong uVar2;
  void *pvVar3;
  uint uVar4;
  
  pBVar1 = iter->array;
  if (iter->contiguous == 0) {
    uVar4 = pBVar1->ndim;
    iter->pos[(long)(int)uVar4 + -1] = iter->pos[(long)(int)uVar4 + -1] + 1;
    pvVar3 = (void *)((long)iter->dataptr + pBVar1->strides[(long)(int)uVar4 + -1]);
    iter->dataptr = pvVar3;
    for (uVar2 = (ulong)uVar4; (0 < (int)uVar2 && (iter->pos[uVar2 - 1] == pBVar1->dims[uVar2 - 1]))
        ; uVar2 = uVar2 - 1) {
      pvVar3 = (void *)((long)pvVar3 - iter->pos[uVar2 - 1] * pBVar1->strides[uVar2 - 1]);
      iter->dataptr = pvVar3;
      iter->pos[uVar2 - 1] = 0;
      if (uVar2 != 1) {
        uVar4 = (int)uVar2 - 2;
        iter->pos[uVar4] = iter->pos[uVar4] + 1;
        pvVar3 = (void *)((long)pvVar3 + pBVar1->strides[uVar4]);
        iter->dataptr = pvVar3;
      }
    }
  }
  else {
    iter->dataptr = (void *)((long)iter->dataptr + pBVar1->strides[(long)pBVar1->ndim + -1]);
  }
  return;
}

Assistant:

void
big_array_iter_advance(BigArrayIter * iter)
{
    BigArray * array = iter->array;

    if(iter->contiguous) {
        iter->dataptr = (char*) iter->dataptr + array->strides[array->ndim - 1];
        return;
    }
    int k;
    iter->pos[array->ndim - 1] ++;
    iter->dataptr = ((char*) iter->dataptr) + array->strides[array->ndim - 1];
    for(k = array->ndim - 1; k >= 0; k --) {
        if(iter->pos[k] == array->dims[k]) {
            iter->dataptr = ((char*) iter->dataptr) - array->strides[k] * iter->pos[k];
            iter->pos[k] = 0;
            if(k > 0) {
                iter->pos[k - 1] ++;
                iter->dataptr = ((char*) iter->dataptr) + array->strides[k - 1];
            }
        } else {
            break;
        }
    }
}